

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_stop(oonf_timer_instance *timer)

{
  oonf_timer_instance *timer_local;
  
  if (timer->_clock != 0) {
    if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 1) != 0) {
      oonf_log(1,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0xcf,0,0,"TIMER: stop %s\n",
               timer->class->name);
    }
    avl_remove(&_timer_tree,timer);
    timer->_clock = 0;
    timer->_random = 0;
    timer->class->_stat_usage = timer->class->_stat_usage - 1;
    if (timer->class->_timer_in_callback == timer) {
      timer->class->_timer_stopped = true;
    }
  }
  return;
}

Assistant:

void
oonf_timer_stop(struct oonf_timer_instance *timer) {
  if (timer->_clock == 0) {
    return;
  }

  OONF_DEBUG(LOG_TIMER, "TIMER: stop %s\n", timer->class->name);

  /* remove timer from tree */
  avl_remove(&_timer_tree, &timer->_node);
  timer->_clock = 0;
  timer->_random = 0;
  timer->class->_stat_usage--;

  if (timer->class->_timer_in_callback == timer) {
    timer->class->_timer_stopped = true;
  }
}